

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

bool tcu::verifyTriangleGroupRasterization
               (Surface *surface,TriangleSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               VerificationMode mode)

{
  Vec4 *p0;
  ostringstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int greenBits;
  int blueBits;
  int aiVar3 [2];
  bool bVar4;
  bool bVar5;
  CoverageType CVar6;
  int iVar7;
  undefined4 uVar8;
  long lVar9;
  Surface *surface_00;
  ChannelType z;
  pointer pSVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar11;
  TestLog *pTVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  pointer pSVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Surface errorMask;
  TextureLevel coverageMap;
  uint local_47c;
  long local_430;
  string local_428;
  VerificationMode local_408;
  float local_404;
  string local_400;
  string local_3e0;
  Surface local_3c0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  TextureLevel local_390;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  pointer local_358;
  long local_350;
  TriangleSceneSpec *local_348;
  RasterizationArguments *local_340;
  long local_338;
  IVec2 local_330;
  LogImageSet local_328;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  LogImage local_288;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  undefined1 auVar23 [16];
  
  iVar11 = args->numSamples;
  aiVar3[0] = surface->m_width;
  aiVar3[1] = surface->m_height;
  local_47c = args->subpixelBits;
  local_1b0._0_4_ = R;
  local_1b0._4_4_ = UNSIGNED_INT8;
  local_408 = mode;
  local_340 = args;
  local_330.m_data = aiVar3;
  TextureLevel::TextureLevel(&local_390,(TextureFormat *)local_1b0,aiVar3[0],aiVar3[1],1);
  Surface::Surface(&local_3c0,surface->m_width,surface->m_height);
  if ((int)local_47c < 0) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Invalid subpixel count (",0x18);
    std::ostream::operator<<(poVar1,local_47c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"), assuming 0",0xd);
    MessageBuilder::operator<<((MessageBuilder *)local_1b0,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    local_47c = 0;
  }
  else if (0x10 < local_47c) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Subpixel count is greater than 16 (",0x23);
    std::ostream::operator<<(poVar1,local_47c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "). Checking results using less strict 16 bit requirements. This may produce false positives."
               ,0x5c);
    MessageBuilder::operator<<((MessageBuilder *)local_1b0,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    local_47c = 0x10;
  }
  TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&local_390);
  local_288.m_name._0_12_ = ZEXT812(2);
  local_288.m_name._M_string_length._4_4_ = 0.0;
  clear((PixelBufferAccess *)local_1b0,(IVec4 *)&local_288);
  pSVar17 = (scene->triangles).
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (scene->triangles).
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pSVar10 - (long)pSVar17) >> 2) * -0x3d70a3d7) {
    local_1d8 = (float)aiVar3[0];
    local_1e8 = (float)aiVar3[1];
    fStack_1c0 = 0.0;
    fStack_1bc = 0.0;
    local_430 = 0;
    lVar9 = 0;
    pTVar12 = log;
    iVar7 = local_390.m_size.m_data[1];
    local_348 = scene;
    fStack_1e4 = local_1e8;
    fStack_1e0 = local_1e8;
    fStack_1dc = local_1e8;
    fStack_1d4 = local_1d8;
    fStack_1d0 = local_1d8;
    fStack_1cc = local_1d8;
    local_1c8 = local_1d8;
    fStack_1c4 = local_1e8;
    do {
      local_338 = lVar9 * 100;
      auVar26._4_4_ = pSVar17[lVar9].positions[1].m_data[0];
      auVar26._0_4_ = pSVar17[lVar9].positions[0].m_data[0];
      auVar26._8_8_ = 0;
      auVar31._4_4_ = *(float *)((long)(pSVar17[lVar9].positions + 1) + 0xc);
      auVar31._0_4_ = *(float *)((long)pSVar17[lVar9].positions[0].m_data + 0xc);
      auVar31._8_8_ = 0;
      auVar27 = divps(auVar26,auVar31);
      local_1f8 = (auVar27._0_4_ + 1.0) * 0.5 * local_1d8;
      fStack_1f4 = (auVar27._4_4_ + 1.0) * 0.5 * fStack_1d4;
      fStack_1f0 = (auVar27._8_4_ + 0.0) * 0.0 * fStack_1d0;
      fStack_1ec = (auVar27._12_4_ + 0.0) * 0.0 * fStack_1cc;
      auVar30._4_4_ = *(float *)((long)(pSVar17[lVar9].positions + 1) + 4);
      auVar30._0_4_ = *(float *)((long)pSVar17[lVar9].positions[0].m_data + 4);
      auVar30._8_8_ = 0;
      auVar31 = divps(auVar30,auVar31);
      fVar29 = (auVar31._0_4_ + 1.0) * 0.5 * local_1e8;
      fVar32 = (auVar31._4_4_ + 1.0) * 0.5 * fStack_1e4;
      fVar25 = (float)(~-(uint)(fVar29 <= fVar32) & (uint)fVar32 |
                      -(uint)(fVar29 <= fVar32) & (uint)fVar29);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)pSVar17[lVar9].positions[2].m_data;
      fVar22 = *(float *)((long)(pSVar17[lVar9].positions + 2) + 0xc);
      auVar27._4_4_ = fVar22;
      auVar27._0_4_ = fVar22;
      auVar27._8_4_ = fVar22;
      auVar27._12_4_ = fVar22;
      auVar31 = divps(auVar28,auVar27);
      local_3a8 = (auVar31._0_4_ + 1.0) * 0.5 * local_1c8;
      fStack_3a4 = (auVar31._4_4_ + 1.0) * 0.5 * fStack_1c4;
      fStack_3a0 = (auVar31._8_4_ + 0.0) * 0.0 * fStack_1c0;
      fStack_39c = (auVar31._12_4_ + 0.0) * 0.0 * fStack_1bc;
      uVar18 = -(uint)(fVar25 <= fStack_3a4);
      local_368 = fStack_3a4;
      fStack_364 = fStack_3a4;
      fStack_360 = fStack_3a4;
      fStack_35c = fStack_3a4;
      local_358 = pSVar10;
      local_350 = lVar9;
      fVar21 = floorf((float)(~uVar18 & (uint)fStack_3a4 | uVar18 & (uint)fVar25));
      fVar25 = (float)(~-(uint)(fStack_1f4 <= local_1f8) & (uint)fStack_1f4 |
                      (uint)local_1f8 & -(uint)(fStack_1f4 <= local_1f8));
      fVar22 = (float)(~-(uint)(fVar32 <= fVar29) & (uint)fVar32 |
                      (uint)fVar29 & -(uint)(fVar32 <= fVar29));
      iVar19 = -(uint)(local_3a8 <= fVar25);
      iVar20 = -(uint)(fStack_3a4 <= fVar22);
      auVar24._4_4_ = iVar20;
      auVar24._0_4_ = iVar19;
      auVar24._8_4_ = iVar20;
      auVar24._12_4_ = iVar20;
      auVar23._8_8_ = auVar24._8_8_;
      auVar23._4_4_ = iVar19;
      auVar23._0_4_ = iVar19;
      uVar18 = movmskpd((int)pTVar12,auVar23);
      if ((uVar18 & 1) == 0) {
        fVar25 = local_3a8;
      }
      local_404 = ceilf(fVar25);
      if ((uVar18 & 2) == 0) {
        fVar22 = local_368;
      }
      fVar22 = ceilf(fVar22);
      local_368 = (float)(int)fVar22;
      z = (int)fVar21;
      if ((int)fVar21 < 1) {
        z = SNORM_INT8;
      }
      iVar19 = iVar7 + -1;
      if ((int)local_368 < iVar7 + -1) {
        iVar19 = (int)local_368;
      }
      pSVar10 = local_358;
      if ((int)z <= iVar19) {
        iVar20 = (int)local_404;
        fVar22 = (float)(~-(uint)(local_1f8 <= fStack_1f4) & (uint)fStack_1f4 |
                        (uint)local_1f8 & -(uint)(local_1f8 <= fStack_1f4));
        uVar18 = -(uint)(fVar22 <= local_3a8);
        fVar22 = floorf((float)(~uVar18 & (uint)local_3a8 | uVar18 & (uint)fVar22));
        local_3a8 = (float)(int)fVar22;
        iVar19 = local_390.m_size.m_data[0];
        if ((int)local_3a8 < 1) {
          local_3a8 = 0.0;
        }
        do {
          iVar13 = iVar19 + -1;
          if (iVar20 < iVar19 + -1) {
            iVar13 = iVar20;
          }
          fVar22 = local_3a8;
          if ((int)local_3a8 <= iVar13) {
            do {
              TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&local_390);
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)&local_288,(int)(PixelBufferAccess *)local_1b0,
                         (int)fVar22,z);
              if (local_288.m_name._M_dataplus._M_p._0_4_ != 0.0) {
                pSVar10 = (scene->triangles).
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                p0 = (Vec4 *)((long)pSVar10->positions[0].m_data + local_338);
                local_1b0._4_4_ = z;
                local_1b0._0_4_ = fVar22;
                CVar6 = calculateTriangleCoverage
                                  (p0,(Vec4 *)((long)(pSVar10->positions + 1) + local_338),
                                   (Vec4 *)((long)(pSVar10->positions + 2) + local_338),
                                   (IVec2 *)local_1b0,&local_330,local_47c,iVar11 != 0);
                if (CVar6 == COVERAGE_PARTIAL) {
                  bVar4 = anon_unknown_3::pixelOnlyOnASharedEdge
                                    ((IVec2 *)(ulong)(uint)fVar22,(SceneTriangle *)(ulong)z,
                                     (IVec2 *)p0);
                  uVar18 = 1;
                  if ((bVar4) &&
                     (uVar14 = (int)((long)(scene->triangles).
                                           super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar10 >> 2) * -0x3d70a3d7, 0 < (int)uVar14)) {
                    uVar15 = (ulong)(uVar14 & 0x7fffffff);
                    bVar4 = false;
                    uVar16 = 1;
                    do {
                      if ((local_430 + uVar16 != 1) &&
                         (bVar5 = anon_unknown_3::pixelOnlyOnASharedEdge
                                            ((IVec2 *)(ulong)(uint)fVar22,(SceneTriangle *)(ulong)z,
                                             (IVec2 *)pSVar10), bVar5)) break;
                      bVar4 = uVar15 <= uVar16;
                      pSVar10 = pSVar10 + 1;
                      bVar5 = uVar16 != uVar15;
                      uVar16 = uVar16 + 1;
                    } while (bVar5);
                    uVar18 = (uint)bVar4;
                    scene = local_348;
                  }
                  TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&local_390);
                  local_288.m_name._0_16_ = ZEXT416(uVar18);
                  PixelBufferAccess::setPixel
                            ((PixelBufferAccess *)local_1b0,(IVec4 *)&local_288,(int)fVar22,z,0);
                }
                else if (CVar6 == COVERAGE_FULL) {
                  TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&local_390);
                  local_288.m_name._0_16_ = ZEXT816(0);
                  PixelBufferAccess::setPixel
                            ((PixelBufferAccess *)local_1b0,(IVec4 *)&local_288,(int)fVar22,z,0);
                }
              }
              fVar22 = (float)((int)fVar22 + 1);
              iVar13 = local_390.m_size.m_data[0] + -1;
              if (iVar20 < local_390.m_size.m_data[0] + -1) {
                iVar13 = iVar20;
              }
              iVar7 = local_390.m_size.m_data[1];
              iVar19 = local_390.m_size.m_data[0];
            } while ((int)fVar22 <= iVar13);
          }
          z = z + SNORM_INT16;
          fVar22 = (float)(iVar7 + -1);
          if ((int)local_368 < iVar7 + -1) {
            fVar22 = local_368;
          }
        } while ((int)z <= (int)fVar22);
        pSVar17 = (scene->triangles).
                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar10 = (scene->triangles).
                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      pTVar12 = (TestLog *)(ulong)local_47c;
      lVar9 = local_350 + 1;
      local_430 = local_430 + -1;
    } while (lVar9 < (int)((ulong)((long)pSVar10 - (long)pSVar17) >> 2) * -0x3d70a3d7);
  }
  local_288.m_name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_3c0.m_pixels.m_cap != (void *)0x0) {
    local_3c0.m_pixels.m_cap = (size_t)local_3c0.m_pixels.m_ptr;
  }
  PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_288,local_3c0.m_width,
             local_3c0.m_height,1,(void *)local_3c0.m_pixels.m_cap);
  local_288.m_name._0_16_ = ZEXT816(0x3f80000000000000) << 0x40;
  clear((PixelBufferAccess *)local_1b0,(Vec4 *)&local_288);
  iVar11 = surface->m_height;
  if (iVar11 < 1) {
    iVar7 = 0;
    iVar19 = 0;
  }
  else {
    iVar20 = surface->m_width;
    iVar13 = 0;
    iVar19 = 0;
    iVar7 = 0;
    do {
      if (0 < iVar20) {
        iVar11 = 0;
        do {
          uVar18 = *(uint *)((long)(surface->m_pixels).m_ptr + (long)(iVar20 * iVar13 + iVar11) * 4)
          ;
          iVar20 = local_340->redBits;
          greenBits = local_340->greenBits;
          blueBits = local_340->blueBits;
          bVar4 = anon_unknown_3::compareColors
                            ((RGBA *)(ulong)uVar18,(RGBA *)0xff000000,iVar20,greenBits,blueBits);
          bVar5 = anon_unknown_3::compareColors
                            ((RGBA *)(ulong)uVar18,(RGBA *)0xffffffff,iVar20,greenBits,blueBits);
          TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&local_390);
          ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)&local_288,(int)(PixelBufferAccess *)local_1b0,iVar11
                     ,iVar13);
          if (local_288.m_name._M_dataplus._M_p._0_4_ == 0.0) {
            uVar8 = 0xffff00ff;
            if (bVar5) {
              uVar8 = 0xff1e1e1e;
            }
            iVar19 = iVar19 + (uint)!bVar5;
LAB_0060179a:
            *(undefined4 *)
             ((long)local_3c0.m_pixels.m_ptr + (long)(local_3c0.m_width * iVar13 + iVar11) * 4) =
                 uVar8;
          }
          else {
            if (local_288.m_name._M_dataplus._M_p._0_4_ == 1.4013e-45) {
              uVar8 = 0xff00ffff;
              goto LAB_0060179a;
            }
            if ((local_288.m_name._M_dataplus._M_p._0_4_ == 2.8026e-45) && (!bVar4)) {
              iVar7 = iVar7 + 1;
              uVar8 = 0xff0000ff;
              goto LAB_0060179a;
            }
          }
          iVar11 = iVar11 + 1;
          iVar20 = surface->m_width;
        } while (iVar11 < iVar20);
        iVar11 = surface->m_height;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < iVar11);
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying rasterization result.",0x1f);
  MessageBuilder::operator<<((MessageBuilder *)local_1b0,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  iVar11 = (int)log;
  if (local_408 == VERIFICATIONMODE_WEAK) {
    if (iVar7 + iVar19 < 0xb) goto LAB_00601c4f;
  }
  else if ((local_408 != VERIFICATIONMODE_STRICT) || (iVar7 + iVar19 < 1)) {
LAB_00601c4f:
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"No invalid pixels found.",0x18);
    MessageBuilder::operator<<((MessageBuilder *)local_1b0,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    paVar2 = &local_328.m_name.field_2;
    local_328.m_name._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"Verification result","");
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Result of rendering","");
    LogImageSet::LogImageSet((LogImageSet *)&local_288,&local_328.m_name,&local_428);
    TestLog::startImageSet
              (log,local_288.m_name._M_dataplus._M_p,local_288.m_description._M_dataplus._M_p);
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Result","");
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"Result","");
    LogImage::LogImage((LogImage *)local_1b0,&local_3e0,&local_400,surface,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b0,iVar11,__buf_01,(size_t)surface);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if (local_288.m_description._M_dataplus._M_p != (pointer)((long)&local_288 + 0x30U)) {
      operator_delete(local_288.m_description._M_dataplus._M_p,
                      local_288.m_description.field_2._M_allocated_capacity + 1);
    }
    if (local_288.m_name._M_dataplus._M_p != (undefined1 *)((long)&local_288 + 0x10U)) {
      operator_delete(local_288.m_name._M_dataplus._M_p,
                      local_288.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.m_name._M_dataplus._M_p != paVar2) {
      operator_delete(local_328.m_name._M_dataplus._M_p,
                      local_328.m_name.field_2._M_allocated_capacity + 1);
    }
    bVar4 = true;
    goto LAB_00601ea9;
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Invalid pixels found:\n\t",0x17);
  std::ostream::operator<<(poVar1,iVar19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," missing pixels. (Marked with purple)\n\t",0x27);
  std::ostream::operator<<(poVar1,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," incorrectly filled pixels. (Marked with red)\n\t",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Unknown (subpixel on edge) pixels are marked with yellow.",0x39);
  MessageBuilder::operator<<((MessageBuilder *)local_1b0,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Verification result","");
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Result of rendering","");
  LogImageSet::LogImageSet(&local_328,&local_428,&local_3e0);
  TestLog::startImageSet
            (log,local_328.m_name._M_dataplus._M_p,local_328.m_description._M_dataplus._M_p);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"Result","");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Result","");
  LogImage::LogImage((LogImage *)local_1b0,&local_400,&local_2a8,surface,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
  LogImage::write((LogImage *)local_1b0,iVar11,__buf,(size_t)surface);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"ErrorMask","");
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"ErrorMask","");
  surface_00 = &local_3c0;
  LogImage::LogImage(&local_288,&local_2c8,&local_2e8,surface_00,QP_IMAGE_COMPRESSION_MODE_BEST);
  LogImage::write(&local_288,iVar11,__buf_00,(size_t)surface_00);
  TestLog::endImageSet(log);
  if (local_288.m_description._M_dataplus._M_p != (pointer)((long)&local_288 + 0x30U)) {
    operator_delete(local_288.m_description._M_dataplus._M_p,
                    local_288.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_288.m_name._M_dataplus._M_p != (undefined1 *)((long)&local_288 + 0x10U)) {
    operator_delete(local_288.m_name._M_dataplus._M_p,
                    local_288.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.m_description._M_dataplus._M_p != &local_328.m_description.field_2) {
    operator_delete(local_328.m_description._M_dataplus._M_p,
                    local_328.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
    operator_delete(local_328.m_name._M_dataplus._M_p,
                    local_328.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  bVar4 = false;
LAB_00601ea9:
  Surface::~Surface(&local_3c0);
  TextureLevel::~TextureLevel(&local_390);
  return bVar4;
}

Assistant:

bool verifyTriangleGroupRasterization (const tcu::Surface& surface, const TriangleSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log, VerificationMode mode)
{
	DE_ASSERT(mode < VERIFICATIONMODE_LAST);

	const tcu::RGBA		backGroundColor				= tcu::RGBA(0, 0, 0, 255);
	const tcu::RGBA		triangleColor				= tcu::RGBA(255, 255, 255, 255);
	const tcu::RGBA		missingPixelColor			= tcu::RGBA(255, 0, 255, 255);
	const tcu::RGBA		unexpectedPixelColor		= tcu::RGBA(255, 0, 0, 255);
	const tcu::RGBA		partialPixelColor			= tcu::RGBA(255, 255, 0, 255);
	const tcu::RGBA		primitivePixelColor			= tcu::RGBA(30, 30, 30, 255);
	const int			weakVerificationThreshold	= 10;
	const bool			multisampled				= (args.numSamples != 0);
	const tcu::IVec2	viewportSize				= tcu::IVec2(surface.getWidth(), surface.getHeight());
	int					missingPixels				= 0;
	int					unexpectedPixels			= 0;
	int					subPixelBits				= args.subpixelBits;
	tcu::TextureLevel	coverageMap					(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT8), surface.getWidth(), surface.getHeight());
	tcu::Surface		errorMask					(surface.getWidth(), surface.getHeight());

	// subpixel bits in in a valid range?

	if (subPixelBits < 0)
	{
		log << tcu::TestLog::Message << "Invalid subpixel count (" << subPixelBits << "), assuming 0" << tcu::TestLog::EndMessage;
		subPixelBits = 0;
	}
	else if (subPixelBits > 16)
	{
		// At high subpixel bit counts we might overflow. Checking at lower bit count is ok, but is less strict
		log << tcu::TestLog::Message << "Subpixel count is greater than 16 (" << subPixelBits << "). Checking results using less strict 16 bit requirements. This may produce false positives." << tcu::TestLog::EndMessage;
		subPixelBits = 16;
	}

	// generate coverage map

	tcu::clear(coverageMap.getAccess(), tcu::IVec4(COVERAGE_NONE, 0, 0, 0));

	for (int triNdx = 0; triNdx < (int)scene.triangles.size(); ++triNdx)
	{
		const tcu::IVec4 aabb = getTriangleAABB(scene.triangles[triNdx], viewportSize);

		for (int y = de::max(0, aabb.y()); y <= de::min(aabb.w(), coverageMap.getHeight() - 1); ++y)
		for (int x = de::max(0, aabb.x()); x <= de::min(aabb.z(), coverageMap.getWidth() - 1); ++x)
		{
			if (coverageMap.getAccess().getPixelUint(x, y).x() == COVERAGE_FULL)
				continue;

			const CoverageType coverage = calculateTriangleCoverage(scene.triangles[triNdx].positions[0],
																	scene.triangles[triNdx].positions[1],
																	scene.triangles[triNdx].positions[2],
																	tcu::IVec2(x, y),
																	viewportSize,
																	subPixelBits,
																	multisampled);

			if (coverage == COVERAGE_FULL)
			{
				coverageMap.getAccess().setPixel(tcu::IVec4(COVERAGE_FULL, 0, 0, 0), x, y);
			}
			else if (coverage == COVERAGE_PARTIAL)
			{
				CoverageType resultCoverage = COVERAGE_PARTIAL;

				// Sharing an edge with another triangle?
				// There should always be such a triangle, but the pixel in the other triangle might be
				// on multiple edges, some of which are not shared. In these cases the coverage cannot be determined.
				// Assume full coverage if the pixel is only on a shared edge in shared triangle too.
				if (pixelOnlyOnASharedEdge(tcu::IVec2(x, y), scene.triangles[triNdx], viewportSize))
				{
					bool friendFound = false;
					for (int friendTriNdx = 0; friendTriNdx < (int)scene.triangles.size(); ++friendTriNdx)
					{
						if (friendTriNdx != triNdx && pixelOnlyOnASharedEdge(tcu::IVec2(x, y), scene.triangles[friendTriNdx], viewportSize))
						{
							friendFound = true;
							break;
						}
					}

					if (friendFound)
						resultCoverage = COVERAGE_FULL;
				}

				coverageMap.getAccess().setPixel(tcu::IVec4(resultCoverage, 0, 0, 0), x, y);
			}
		}
	}

	// check pixels

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	for (int y = 0; y < surface.getHeight(); ++y)
	for (int x = 0; x < surface.getWidth(); ++x)
	{
		const tcu::RGBA		color				= surface.getPixel(x, y);
		const bool			imageNoCoverage		= compareColors(color, backGroundColor, args.redBits, args.greenBits, args.blueBits);
		const bool			imageFullCoverage	= compareColors(color, triangleColor, args.redBits, args.greenBits, args.blueBits);
		CoverageType		referenceCoverage	= (CoverageType)coverageMap.getAccess().getPixelUint(x, y).x();

		switch (referenceCoverage)
		{
			case COVERAGE_NONE:
				if (!imageNoCoverage)
				{
					// coverage where there should not be
					++unexpectedPixels;
					errorMask.setPixel(x, y, unexpectedPixelColor);
				}
				break;

			case COVERAGE_PARTIAL:
				// anything goes
				errorMask.setPixel(x, y, partialPixelColor);
				break;

			case COVERAGE_FULL:
				if (!imageFullCoverage)
				{
					// no coverage where there should be
					++missingPixels;
					errorMask.setPixel(x, y, missingPixelColor);
				}
				else
				{
					errorMask.setPixel(x, y, primitivePixelColor);
				}
				break;

			default:
				DE_ASSERT(false);
		};
	}

	// Output results
	log << tcu::TestLog::Message << "Verifying rasterization result." << tcu::TestLog::EndMessage;

	if (((mode == VERIFICATIONMODE_STRICT) && (missingPixels + unexpectedPixels > 0)) ||
		((mode == VERIFICATIONMODE_WEAK)   && (missingPixels + unexpectedPixels > weakVerificationThreshold)))
	{
		log << tcu::TestLog::Message << "Invalid pixels found:\n\t"
			<< missingPixels << " missing pixels. (Marked with purple)\n\t"
			<< unexpectedPixels << " incorrectly filled pixels. (Marked with red)\n\t"
			<< "Unknown (subpixel on edge) pixels are marked with yellow."
			<< tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result",	"Result",		surface)
			<< tcu::TestLog::Image("ErrorMask", "ErrorMask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		log << tcu::TestLog::Message << "No invalid pixels found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}